

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O0

void __thiscall CPU::MOS6502::State::Inputs::Inputs(Inputs *this)

{
  bool bVar1;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_41;
  string local_40;
  Inputs *local_10;
  Inputs *this_local;
  
  local_10 = this;
  Reflection::StructImpl<CPU::MOS6502::State::Inputs>::StructImpl
            (&this->super_StructImpl<CPU::MOS6502::State::Inputs>);
  (this->super_StructImpl<CPU::MOS6502::State::Inputs>).super_Struct._vptr_Struct =
       (_func_int **)&PTR_all_keys_abi_cxx11__00ca9528;
  bVar1 = Reflection::StructImpl<CPU::MOS6502::State::Inputs>::needs_declare
                    (&this->super_StructImpl<CPU::MOS6502::State::Inputs>);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"ready",&local_41);
    Reflection::StructImpl<CPU::MOS6502::State::Inputs>::declare<bool>
              (&this->super_StructImpl<CPU::MOS6502::State::Inputs>,&this->ready,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"irq",&local_69);
    Reflection::StructImpl<CPU::MOS6502::State::Inputs>::declare<bool>
              (&this->super_StructImpl<CPU::MOS6502::State::Inputs>,&this->irq,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"nmi",&local_91);
    Reflection::StructImpl<CPU::MOS6502::State::Inputs>::declare<bool>
              (&this->super_StructImpl<CPU::MOS6502::State::Inputs>,&this->nmi,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"reset",&local_b9);
    Reflection::StructImpl<CPU::MOS6502::State::Inputs>::declare<bool>
              (&this->super_StructImpl<CPU::MOS6502::State::Inputs>,&this->reset,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
  }
  return;
}

Assistant:

State::Inputs::Inputs() {
	if(needs_declare()) {
		DeclareField(ready);
		DeclareField(irq);
		DeclareField(nmi);
		DeclareField(reset);
	}
}